

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

QPlatformMenuItem * __thiscall
QMenuPrivate::insertActionInPlatformMenu
          (QMenuPrivate *this,QAction *action,QPlatformMenuItem *beforeItem)

{
  QObject *pQVar1;
  QPlatformMenuItem *item;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  QObject local_68 [8];
  code *local_60;
  ImplFn local_58;
  Connection local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  item = (QPlatformMenuItem *)(**(code **)(*(long *)(this->platformMenu).wp.value + 0xf0))();
  (**(code **)(*(long *)item + 0x60))(item,action);
  local_60 = QAction::trigger;
  local_58 = (ImplFn)0x0;
  local_48 = QPlatformMenuItem::activated;
  local_40 = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QCallableObject<void_(QAction::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = QAction::trigger;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_50,(void **)item,(QObject *)&local_48,(void **)action,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x2,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_50);
  local_60 = QAction::hovered;
  local_58 = (ImplFn)0x0;
  local_48 = QPlatformMenuItem::hovered;
  local_40 = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QCallableObject<void_(QAction::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = QAction::hovered;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)item,(QObject *)&local_48,(void **)action,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x2,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  copyActionToPlatformItem(this,action,item);
  pQVar1 = (this->platformMenu).wp.value;
  (**(code **)(*(long *)pQVar1 + 0x60))(pQVar1,item,beforeItem);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return item;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformMenuItem * QMenuPrivate::insertActionInPlatformMenu(const QAction *action, QPlatformMenuItem *beforeItem)
{
    QPlatformMenuItem *menuItem = platformMenu->createMenuItem();
    Q_ASSERT(menuItem);

    menuItem->setTag(reinterpret_cast<quintptr>(action));
    QObject::connect(menuItem, &QPlatformMenuItem::activated, action, &QAction::trigger, Qt::QueuedConnection);
    QObject::connect(menuItem, &QPlatformMenuItem::hovered, action, &QAction::hovered, Qt::QueuedConnection);
    copyActionToPlatformItem(action, menuItem);
    platformMenu->insertMenuItem(menuItem, beforeItem);

    return menuItem;
}